

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O0

void cf2_arrstack_setCount(CF2_ArrStack arrstack,size_t numElements)

{
  FT_Bool FVar1;
  size_t numElements_local;
  CF2_ArrStack arrstack_local;
  
  if ((numElements <= arrstack->allocated) ||
     (FVar1 = cf2_arrstack_setNumElements(arrstack,numElements), FVar1 != '\0')) {
    arrstack->count = numElements;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_arrstack_setCount( CF2_ArrStack  arrstack,
                         size_t        numElements )
  {
    FT_ASSERT( arrstack );

    if ( numElements > arrstack->allocated )
    {
      /* expand the allocation first */
      if ( !cf2_arrstack_setNumElements( arrstack, numElements ) )
        return;
    }

    arrstack->count = numElements;
  }